

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertUTF.cpp
# Opt level: O1

ConversionResult
convertUTF::ConvertUTF8toUTF32
          (UTF8 **sourceStart,UTF8 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags)

{
  long lVar1;
  byte bVar2;
  byte bVar3;
  Boolean BVar4;
  int iVar5;
  uint uVar6;
  ConversionResult CVar7;
  ulong uVar8;
  byte *source;
  bool bVar9;
  uint *local_58;
  
  source = *sourceStart;
  local_58 = *targetStart;
  CVar7 = conversionOK;
  do {
    if (sourceEnd <= source) break;
    bVar2 = *source;
    bVar3 = trailingBytesForUTF8[bVar2];
    uVar8 = (ulong)bVar3;
    if (source + uVar8 < sourceEnd) {
      lVar1 = uVar8 + 1;
      BVar4 = anon_unknown_11::isLegalUTF8(source,(int)lVar1);
      bVar9 = false;
      iVar5 = 0;
      if (BVar4) {
        switch(uVar8) {
        case 0:
          uVar6 = (uint)bVar3;
          break;
        case 5:
          source = source + 1;
          iVar5 = (uint)bVar2 << 6;
        case 4:
          bVar2 = *source;
          source = source + 1;
          iVar5 = ((uint)bVar2 + iVar5) * 0x40;
        case 3:
          bVar2 = *source;
          source = source + 1;
          iVar5 = ((uint)bVar2 + iVar5) * 0x40;
        case 2:
          bVar2 = *source;
          source = source + 1;
          iVar5 = ((uint)bVar2 + iVar5) * 0x40;
        case 1:
          bVar2 = *source;
          source = source + 1;
          uVar6 = ((uint)bVar2 + iVar5) * 0x40;
          break;
        default:
          goto switchD_00183654_default;
        }
        bVar2 = *source;
        source = source + 1;
        iVar5 = bVar2 + uVar6;
switchD_00183654_default:
        if (targetEnd <= local_58) {
          source = source + -lVar1;
          CVar7 = targetExhausted;
          goto LAB_00183660;
        }
        uVar6 = iVar5 - *(int *)(offsetsFromUTF8 + uVar8 * 4);
        if (uVar6 < 0x110000) {
          bVar9 = (uVar6 & 0x1ff800) == 0xd800;
          if (bVar9) {
            uVar6 = 0xfffd;
          }
          if (bVar9 && flags == strictConversion) {
            source = source + -lVar1;
            CVar7 = sourceIllegal;
            goto LAB_00183660;
          }
        }
        else {
          CVar7 = sourceIllegal;
          uVar6 = 0xfffd;
        }
        *local_58 = uVar6;
        local_58 = local_58 + 1;
        bVar9 = true;
      }
      else {
        CVar7 = sourceIllegal;
      }
    }
    else {
      CVar7 = sourceExhausted;
LAB_00183660:
      bVar9 = false;
    }
  } while (bVar9);
  *sourceStart = source;
  *targetStart = local_58;
  return CVar7;
}

Assistant:

ConversionResult ConvertUTF8toUTF32(const UTF8** sourceStart, const UTF8* sourceEnd, UTF32** targetStart,
                                    const UTF32* targetEnd, const ConversionFlags flags)
{
    ConversionResult result = ConversionResult::conversionOK;
    const UTF8* source = *sourceStart;
    UTF32* target = *targetStart;
    while (source < sourceEnd)
    {
        UTF32 ch = 0;
        const uint8_t extraBytesToRead = trailingBytesForUTF8[*source];
        if (source + extraBytesToRead >= sourceEnd)
        {
            result = ConversionResult::sourceExhausted;
            break;
        }
        /* Do this check whether lenient or strict */
        if (!isLegalUTF8(source, extraBytesToRead + 1))
        {
            result = ConversionResult::sourceIllegal;
            break;
        }
        /*
         * The cases all fall through. See "Note A" below.
         */
        switch (extraBytesToRead)
        {
        case 5:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 4:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 3:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 2:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 1:
            ch += *source++;
            ch <<= 6;
            [[fallthrough]];
        case 0:
            ch += *source++;
            break;
        default:;
        }
        ch -= offsetsFromUTF8[extraBytesToRead];

        if (target >= targetEnd)
        {
            source -= (extraBytesToRead + 1); /* Back up the source pointer! */
            result = ConversionResult::targetExhausted;
            break;
        }
        if (ch <= UNI_MAX_LEGAL_UTF32)
        {
            /*
             * UTF-16 surrogate values are illegal in UTF-32, and anything
             * over Plane 17 (> 0x10FFFF) is illegal.
             */
            if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_LOW_END)
            {
                if (flags == ConversionFlags::strictConversion)
                {
                    source -= (extraBytesToRead + 1); /* return to the illegal value itself */
                    result = ConversionResult::sourceIllegal;
                    break;
                }
                *target++ = UNI_REPLACEMENT_CHAR;
            }
            else
            {
                *target++ = ch;
            }
        }
        else
        { /* i.e., ch > UNI_MAX_LEGAL_UTF32 */
            result = ConversionResult::sourceIllegal;
            *target++ = UNI_REPLACEMENT_CHAR;
        }
    }
    *sourceStart = source;
    *targetStart = target;
    return result;
}